

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O2

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  void *pvVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_13;
  int64_t eval_b_14;
  sockaddr_in addr;
  uv_buf_t local_538;
  sockaddr_in addr3;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  
  can_recverr = 1;
  req1.data = (void *)0x0;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_b_14 = (int64_t)iVar1;
  req2.data = (void *)eval_b_14;
  if (req1.data == (void *)eval_b_14) {
    req1.data = (void *)0x0;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,&addr2);
    eval_b_14 = (int64_t)iVar1;
    req2.data = (void *)eval_b_14;
    if (req1.data == (void *)eval_b_14) {
      req1.data = (void *)0x0;
      iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,&addr3);
      eval_b_14 = (int64_t)iVar1;
      req2.data = (void *)eval_b_14;
      if (req1.data == (void *)eval_b_14) {
        puVar2 = uv_default_loop();
        iVar1 = uv_timer_init(puVar2,&timer);
        pvVar3 = (void *)(long)iVar1;
        req2.data = (void *)0x0;
        req1.data = pvVar3;
        if (pvVar3 == (void *)0x0) {
          iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
          pvVar3 = (void *)(long)iVar1;
          req2.data = (void *)0x0;
          req1.data = pvVar3;
          if (pvVar3 == (void *)0x0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_udp_init(puVar2,&client);
            pvVar3 = (void *)(long)iVar1;
            req2.data = (void *)0x0;
            req1.data = pvVar3;
            if (pvVar3 == (void *)0x0) {
              iVar1 = uv_udp_bind(&client,(sockaddr *)&addr2,0);
              pvVar3 = (void *)(long)iVar1;
              req2.data = (void *)0x0;
              req1.data = pvVar3;
              if (pvVar3 == (void *)0x0) {
                iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
                pvVar3 = (void *)(long)iVar1;
                req2.data = (void *)0x0;
                req1.data = pvVar3;
                if (pvVar3 == (void *)0x0) {
                  local_538 = uv_buf_init("PING",4);
                  iVar1 = uv_udp_send(&req1,&client,&local_538,1,(sockaddr *)&addr,send_cb);
                  pvVar3 = (void *)(long)iVar1;
                  req3.data = (void *)0x0;
                  req2.data = pvVar3;
                  if (pvVar3 == (void *)0x0) {
                    local_538 = uv_buf_init("PANG",4);
                    iVar1 = uv_udp_send(&req2,&client,&local_538,1,(sockaddr *)&addr,send_cb);
                    req3.data = (void *)(long)iVar1;
                    req4.data = (void *)0x0;
                    if (req3.data == (void *)0x0) {
                      puVar2 = uv_default_loop();
                      iVar1 = uv_udp_init(puVar2,&client2);
                      req3.data = (void *)(long)iVar1;
                      req4.data = (void *)0x0;
                      if (req3.data == (void *)0x0) {
                        iVar1 = uv_udp_bind(&client2,(sockaddr *)&addr3,0x20);
                        req3.data = (void *)(long)iVar1;
                        req4.data = (void *)0x0;
                        if (req3.data == (void *)0x0) {
                          iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
                          req3.data = (void *)(long)iVar1;
                          req4.data = (void *)0x0;
                          if (req3.data == (void *)0x0) {
                            local_538 = uv_buf_init("PING",4);
                            iVar1 = uv_udp_send(&req3,&client2,&local_538,1,(sockaddr *)&addr,
                                                send_cb_recverr);
                            req4.data = (void *)(long)iVar1;
                            if (req4.data == (void *)0x0) {
                              local_538 = uv_buf_init("PANG",4);
                              iVar1 = uv_udp_send(&req4,&client2,&local_538,1,(sockaddr *)&addr,
                                                  send_cb_recverr);
                              pvVar3 = (void *)(long)iVar1;
                              eval_b_14 = 0;
                              if (pvVar3 == (void *)0x0) {
                                puVar2 = uv_default_loop();
                                uv_run(puVar2,UV_RUN_DEFAULT);
                                pvVar3 = (void *)(long)send_cb_called;
                                eval_b_14 = 4;
                                if (pvVar3 == (void *)0x4) {
                                  pvVar3 = (void *)(long)recv_cb_called;
                                  eval_b_14 = (int64_t)alloc_cb_called;
                                  if (pvVar3 == (void *)eval_b_14) {
                                    pvVar3 = (void *)(long)timer_cb_called;
                                    eval_b_14 = 1;
                                    if (pvVar3 == (void *)0x1) {
                                      pvVar3 = (void *)(long)close_cb_called;
                                      eval_b_14 = 3;
                                      if (pvVar3 == (void *)0x3) {
                                        puVar2 = uv_default_loop();
                                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                        uv_run(puVar2,UV_RUN_DEFAULT);
                                        puVar2 = uv_default_loop();
                                        iVar1 = uv_loop_close(puVar2);
                                        if (iVar1 != 0) {
                                          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                                                  ,199,"0 == uv_loop_close(uv_default_loop())");
                                          abort();
                                        }
                                        uv_library_shutdown();
                                        return 0;
                                      }
                                      pcVar6 = "(long)(can_recverr ? 3 : 2)";
                                      pcVar5 = "close_cb_called";
                                      uVar4 = 0xc5;
                                    }
                                    else {
                                      pcVar6 = "1";
                                      pcVar5 = "timer_cb_called";
                                      uVar4 = 0xc4;
                                    }
                                  }
                                  else {
                                    pcVar6 = "alloc_cb_called";
                                    pcVar5 = "recv_cb_called";
                                    uVar4 = 0xc3;
                                  }
                                }
                                else {
                                  pcVar6 = "(long)(can_recverr ? 4 : 2)";
                                  pcVar5 = "send_cb_called";
                                  uVar4 = 0xc2;
                                }
                              }
                              else {
                                pcVar6 = "0";
                                pcVar5 = "r";
                                uVar4 = 0xbd;
                              }
                            }
                            else {
                              pcVar6 = "0";
                              pcVar5 = "r";
                              uVar4 = 0xb3;
                              eval_b_14 = 0;
                              pvVar3 = req4.data;
                            }
                            goto LAB_00174119;
                          }
                          uVar4 = 0xa8;
                        }
                        else {
                          uVar4 = 0xa5;
                        }
                      }
                      else {
                        uVar4 = 0xa0;
                      }
                    }
                    else {
                      uVar4 = 0x9c;
                    }
                    req4.data = (void *)0x0;
                    pcVar6 = "0";
                    pcVar5 = "r";
                    eval_b_14 = 0;
                    pvVar3 = req3.data;
                  }
                  else {
                    pcVar6 = "0";
                    pcVar5 = "r";
                    uVar4 = 0x92;
                    eval_b_14 = 0;
                  }
                }
                else {
                  pcVar6 = "0";
                  pcVar5 = "r";
                  uVar4 = 0x87;
                  eval_b_14 = (int64_t)req2.data;
                }
              }
              else {
                pcVar6 = "0";
                pcVar5 = "r";
                uVar4 = 0x84;
                eval_b_14 = (int64_t)req2.data;
              }
            }
            else {
              pcVar6 = "0";
              pcVar5 = "r";
              uVar4 = 0x81;
              eval_b_14 = (int64_t)req2.data;
            }
          }
          else {
            pcVar6 = "0";
            pcVar5 = "r";
            uVar4 = 0x7e;
            eval_b_14 = (int64_t)req2.data;
          }
        }
        else {
          pcVar6 = "0";
          pcVar5 = "r";
          uVar4 = 0x7b;
          eval_b_14 = (int64_t)req2.data;
        }
      }
      else {
        pcVar6 = "uv_ip4_addr(\"127.0.0.1\", 9125, &addr3)";
        pcVar5 = "0";
        uVar4 = 0x78;
        pvVar3 = req1.data;
      }
    }
    else {
      pcVar6 = "uv_ip4_addr(\"127.0.0.1\", 9124, &addr2)";
      pcVar5 = "0";
      uVar4 = 0x77;
      pvVar3 = req1.data;
    }
  }
  else {
    pcVar6 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    pcVar5 = "0";
    uVar4 = 0x76;
    pvVar3 = req1.data;
  }
LAB_00174119:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
          ,uVar4,pcVar5,"==",pcVar6,pvVar3,"==",eval_b_14);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_EQ(r, 0);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_EQ(r, 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_EQ(r, 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_EQ(r, 0);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_EQ(r, 0);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_EQ(r, 0);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_EQ(r, 0);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(timer_cb_called, 1);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY();
  return 0;
}